

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

bool __thiscall
cs_impl::any::
holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::compare
          (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,baseHolder *obj)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar3 = (*obj->_vptr_baseHolder[2])(obj);
  iVar4 = (*(this->super_baseHolder)._vptr_baseHolder[2])(this);
  bVar1 = std::type_info::operator==
                    ((type_info *)CONCAT44(extraout_var,iVar3),
                     (type_info *)CONCAT44(extraout_var_00,iVar4));
  if (bVar1) {
    _Var2 = std::operator==(&this->mDat,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (obj + 1));
    return _Var2;
  }
  return false;
}

Assistant:

bool compare(const baseHolder *obj) const override
			{
				if (obj->type() == this->type())
					return cs_impl::compare(mDat, static_cast<const holder<T> *>(obj)->data());
				else
					return false;
			}